

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::format<char[13],unsigned_long,std::__cxx11::string,std::__cxx11::string,long>
               (ostream *out,char *fmt,char (*args) [13],unsigned_long *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               long *args_4)

{
  long in_FS_OFFSET;
  FormatArg local_80;
  unsigned_long *local_68;
  code *local_60;
  code *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  code *local_48;
  code *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  code *local_30;
  code *local_28;
  long *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.m_formatImpl = detail::FormatArg::formatImpl<char[13]>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<char[13]>;
  local_60 = detail::FormatArg::formatImpl<unsigned_long>;
  local_58 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_48 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_40 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_28 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_20 = args_4;
  local_18 = detail::FormatArg::formatImpl<long>;
  local_10 = detail::FormatArg::toIntImpl<long>;
  local_80.m_value = args;
  local_68 = args_1;
  local_50 = args_2;
  local_38 = args_3;
  detail::formatImpl(out,fmt,&local_80,5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}